

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O2

void __thiscall soplex::SPxDevexPR<double>::left4(SPxDevexPR<double> *this,int n,SPxId id)

{
  int iVar1;
  SPxSolverBase<double> *pSVar2;
  pointer pdVar3;
  UpdateVector<double> *pUVar4;
  pointer pdVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  if (id.super_DataKey.info != 0) {
    pSVar2 = (this->super_SPxPricer<double>).thesolver;
    pdVar3 = (pSVar2->theFvec->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar7 = 1.0 / pdVar3[n];
    dVar8 = SSVectorBase<double>::length2(&pSVar2->theCoPvec->thedelta);
    dVar7 = dVar8 * dVar7 * dVar7;
    pUVar4 = ((this->super_SPxPricer<double>).thesolver)->theFvec;
    for (uVar6 = (ulong)(uint)(pUVar4->thedelta).super_IdxSet.num; 0 < (int)uVar6; uVar6 = uVar6 - 1
        ) {
      iVar1 = (pUVar4->thedelta).super_IdxSet.idx[uVar6 - 1];
      dVar8 = pdVar3[iVar1];
      pdVar5 = (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5[iVar1] = dVar8 * dVar8 * dVar7 + pdVar5[iVar1];
    }
    (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[n] = dVar7;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }